

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

int signo(int A,int B)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = (B & A) >> ((byte)tp & 0x1f);
  uVar1 = tp + tq;
  if (uVar1 != 0 && SCARRY4(tp,tq) == (int)uVar1 < 0) {
    uVar4 = 0;
    do {
      uVar2 = uVar4 + 1;
      uVar5 = A >> ((byte)uVar2 & 0x1f);
      if (((uint)B >> (uVar4 & 0x1f) & 1) == 0) {
        uVar5 = 0;
      }
      uVar3 = uVar3 ^ uVar5;
      uVar4 = uVar2;
    } while (uVar1 != uVar2);
  }
  uVar3 = uVar3 - ((uVar3 >> 3 & 0x11111111) + (uVar3 >> 2 & 0x33333333) + (uVar3 >> 1 & 0x77777777)
                  );
  uVar3 = (uVar3 >> 4) + uVar3;
  return -(uVar3 - (uVar3 & 0xf0f0f0f) / 0xff & 1) | 1;
}

Assistant:

int signo(int A,int B)
{
	int sig=1;
	int tA2=((A>>tp)&(B>>tp));
	//int tA2=0; 
	for(register int i=0;i<(tp+tq);i++)
	{
		if((B>>i)&1)
			tA2=tA2^(A>>(i+1));
	}

	if(bits(tA2)&1){sig=-1;}

//return bits(tA2)&1;
return sig;
}